

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectInvariants
          (Interpreter *this,HeapObject *curr,HeapObject *self,uint *counter,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *thunks)

{
  _Rb_tree_header *p_Var1;
  unsigned_long uVar2;
  byte bVar3;
  uint uVar4;
  AST *pAVar5;
  Identifier *pIVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  value_type from;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  HeapThunk *el_th;
  value_type local_68;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *local_50;
  uint *local_48;
  long *local_40;
  long *local_38;
  
  if (curr != (HeapObject *)0x0) {
    do {
      lVar9 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                             &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
      if (lVar9 == 0) {
        lVar9 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                               &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
        if (lVar9 != 0) {
          local_40 = (long *)(lVar9 + 0x70);
          local_38 = *(long **)(lVar9 + 0x70);
          if (local_38 != local_40) {
            local_50 = &(this->heap).entities;
            local_58 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header;
            local_60 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header;
            local_48 = counter;
            do {
              pAVar5 = (AST *)local_38[2];
              pIVar6 = this->idInvariant;
              uVar4 = *local_48;
              from = (value_type)operator_new(0x70);
              *(undefined2 *)&(from->super_HeapEntity).type = 0;
              (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0023a660;
              from->name = pIVar6;
              p_Var1 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
              (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var1->_M_header;
              (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var1->_M_header;
              (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              from->self = self;
              from->offset = uVar4;
              from->body = pAVar5;
              local_68 = from;
              std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
              ::push_back(local_50,(value_type *)&local_68);
              bVar3 = (this->heap).lastMark;
              (from->super_HeapEntity).mark = bVar3;
              lVar11 = (long)(this->heap).entities.
                             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->heap).entities.
                             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar12 = lVar11 >> 3;
              (this->heap).numEntities = uVar12;
              if (((this->heap).gcTuneMinObjects < uVar12) &&
                 (auVar13._8_4_ = (int)(lVar11 >> 0x23), auVar13._0_8_ = uVar12,
                 auVar13._12_4_ = 0x45300000, uVar2 = (this->heap).lastNumEntities,
                 auVar14._8_4_ = (int)(uVar2 >> 0x20), auVar14._0_8_ = uVar2,
                 auVar14._12_4_ = 0x45300000,
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
                 (this->heap).gcTuneGrowthTrigger <
                 (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0))) {
                Heap::markFrom((Heap *)(ulong)bVar3,(HeapEntity *)from);
                Stack::mark((Stack *)(this->stack).stack.
                                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                            (Heap *)(this->stack).stack.
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
                if (((this->scratch).t & ARRAY) != NULL_TYPE) {
                  Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(this->scratch).v.h)
                  ;
                }
                p_Var8 = local_58;
                p_Var10 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                ;
                p_Var7 = local_60;
                while (local_60 = p_Var7, p_Var10 != p_Var8) {
                  if (*(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40) != (HeapEntity *)0x0) {
                    Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                                   *(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40));
                  }
                  p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
                  p_Var7 = local_60;
                }
                for (p_Var10 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left; p_Var10 != p_Var7;
                    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                  Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                                 *(HeapEntity **)(p_Var10 + 2));
                }
                Heap::sweep(&this->heap);
              }
              local_68 = from;
              std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::operator=(&from->upValues,
                          (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                           *)(lVar9 + 0x10));
              std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::push_back(thunks,&local_68);
              local_38 = (long *)*local_38;
              counter = local_48;
            } while (local_38 != local_40);
          }
        }
        break;
      }
      objectInvariants(this,*(HeapObject **)(lVar9 + 0x18),self,counter,thunks);
      curr = *(HeapObject **)(lVar9 + 0x10);
    } while (curr != (HeapObject *)0x0);
  }
  *counter = *counter + 1;
  return;
}

Assistant:

void objectInvariants(HeapObject *curr, HeapObject *self, unsigned &counter,
                          std::vector<HeapThunk *> &thunks)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            objectInvariants(ext->right, self, counter, thunks);
            objectInvariants(ext->left, self, counter, thunks);
        } else {
            if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                for (AST *assert : simp->asserts) {
                    auto *el_th = makeHeap<HeapThunk>(idInvariant, self, counter, assert);
                    el_th->upValues = simp->upValues;
                    thunks.push_back(el_th);
                }
            }
            counter++;
        }
    }